

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clangs.c
# Opt level: O2

float clangs(char *norm,SuperMatrix *A)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  int iVar4;
  void *addr;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  singlecomplex *psVar11;
  long lVar12;
  double dVar13;
  float fVar14;
  undefined8 uStack_160;
  float local_154;
  char msg [256];
  
  iVar1 = A->nrow;
  iVar6 = A->ncol;
  iVar4 = iVar6;
  if (iVar1 < iVar6) {
    iVar4 = iVar1;
  }
  if (iVar4 == 0) {
    return 0.0;
  }
  pvVar2 = A->Store;
  lVar3 = *(long *)((long)pvVar2 + 8);
  switch(*norm) {
  case 'E':
  case 'F':
    pcVar8 = "Not implemented.";
    uStack_160 = 0x75;
    goto LAB_0011484a;
  case 'I':
    addr = superlu_malloc((long)iVar1 << 2);
    if (addr == (void *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for rwork.",0x67,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/clangs.c");
      superlu_abort_and_exit(msg);
    }
    uVar7 = 0;
    uVar5 = (ulong)(uint)A->nrow;
    if (A->nrow < 1) {
      uVar5 = uVar7;
    }
    for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      *(undefined4 *)((long)addr + uVar7 * 4) = 0;
    }
    lVar12 = 0;
    while (lVar12 < A->ncol) {
      lVar9 = *(long *)((long)pvVar2 + 0x18);
      lVar10 = (long)*(int *)(lVar9 + lVar12 * 4);
      lVar12 = lVar12 + 1;
      psVar11 = (singlecomplex *)(lVar3 + lVar10 * 8);
      for (; lVar10 < *(int *)(lVar9 + lVar12 * 4); lVar10 = lVar10 + 1) {
        lVar9 = (long)*(int *)(*(long *)((long)pvVar2 + 0x10) + lVar10 * 4);
        dVar13 = c_abs(psVar11);
        *(float *)((long)addr + lVar9 * 4) =
             (float)((double)*(float *)((long)addr + lVar9 * 4) + dVar13);
        lVar9 = *(long *)((long)pvVar2 + 0x18);
        psVar11 = psVar11 + 1;
      }
    }
    uVar7 = 0;
    uVar5 = (ulong)(uint)A->nrow;
    if (A->nrow < 1) {
      uVar5 = uVar7;
    }
    local_154 = 0.0;
    for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      fVar14 = *(float *)((long)addr + uVar7 * 4);
      if (local_154 <= fVar14) {
        local_154 = fVar14;
      }
    }
    superlu_free(addr);
    break;
  case 'M':
    local_154 = 0.0;
    lVar12 = 0;
    while (lVar12 < iVar6) {
      lVar9 = *(long *)((long)pvVar2 + 0x18);
      lVar10 = (long)*(int *)(lVar9 + lVar12 * 4);
      lVar12 = lVar12 + 1;
      psVar11 = (singlecomplex *)(lVar3 + lVar10 * 8);
      for (; lVar10 < *(int *)(lVar9 + lVar12 * 4); lVar10 = lVar10 + 1) {
        dVar13 = c_abs(psVar11);
        if ((double)local_154 <= dVar13) {
          dVar13 = c_abs(psVar11);
          local_154 = (float)dVar13;
        }
        lVar9 = *(long *)((long)pvVar2 + 0x18);
        psVar11 = psVar11 + 1;
      }
      iVar6 = A->ncol;
    }
    break;
  case 'O':
switchD_00114791_caseD_4f:
    local_154 = 0.0;
    lVar12 = 0;
    while (lVar12 < iVar6) {
      lVar9 = *(long *)((long)pvVar2 + 0x18);
      lVar10 = (long)*(int *)(lVar9 + lVar12 * 4);
      lVar12 = lVar12 + 1;
      psVar11 = (singlecomplex *)(lVar3 + lVar10 * 8);
      fVar14 = 0.0;
      for (; lVar10 < *(int *)(lVar9 + lVar12 * 4); lVar10 = lVar10 + 1) {
        dVar13 = c_abs(psVar11);
        fVar14 = (float)((double)fVar14 + dVar13);
        lVar9 = *(long *)((long)pvVar2 + 0x18);
        psVar11 = psVar11 + 1;
      }
      if (local_154 <= fVar14) {
        local_154 = fVar14;
      }
      iVar6 = A->ncol;
    }
    break;
  default:
    if (*norm == '1') goto switchD_00114791_caseD_4f;
  case 'G':
  case 'H':
  case 'J':
  case 'K':
  case 'L':
  case 'N':
    pcVar8 = "Illegal norm specified.";
    uStack_160 = 0x77;
LAB_0011484a:
    sprintf(msg,"%s at line %d in file %s\n",pcVar8,uStack_160,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/clangs.c");
    superlu_abort_and_exit(msg);
  }
  return local_154;
}

Assistant:

float clangs(char *norm, SuperMatrix *A)
{
    
    /* Local variables */
    NCformat *Astore;
    singlecomplex   *Aval;
    int      i, j, irow;
    float   value = 0., sum;
    float   *rwork;

    Astore = A->Store;
    Aval   = Astore->nzval;
    
    if ( SUPERLU_MIN(A->nrow, A->ncol) == 0) {
    } else if (strncmp(norm, "M", 1)==0) {
	/* Find max(abs(A(i,j))). */
	for (j = 0; j < A->ncol; ++j)
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; i++)
		value = SUPERLU_MAX( value, c_abs( &Aval[i]) );
	
    } else if (strncmp(norm, "O", 1)==0 || *(unsigned char *)norm == '1') {
	/* Find norm1(A). */
	for (j = 0; j < A->ncol; ++j) {
	    sum = 0.;
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; i++) 
		sum += c_abs( &Aval[i] );
	    value = SUPERLU_MAX(value,sum);
	}
	
    } else if (strncmp(norm, "I", 1)==0) {
	/* Find normI(A). */
	if ( !(rwork = (float *) SUPERLU_MALLOC(A->nrow * sizeof(float))) )
	    ABORT("SUPERLU_MALLOC fails for rwork.");
	for (i = 0; i < A->nrow; ++i) rwork[i] = 0.;
	for (j = 0; j < A->ncol; ++j)
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; i++) {
		irow = Astore->rowind[i];
		rwork[irow] += c_abs( &Aval[i] );
	    }
	for (i = 0; i < A->nrow; ++i)
	    value = SUPERLU_MAX(value, rwork[i]);
	
	SUPERLU_FREE (rwork);
	
    } else if (strncmp(norm, "F", 1)==0 || strncmp(norm, "E", 1)==0) {
	/* Find normF(A). */
	ABORT("Not implemented.");
    } else
	ABORT("Illegal norm specified.");

    return (value);

}